

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,status_type *S)

{
  undefined4 uVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wistream *pwVar3;
  long lVar4;
  status_type S_new;
  delim_c local_4d;
  delim_c local_4c;
  delim_c local_4b;
  delim_c local_4a;
  delim_c local_49;
  result_type local_48;
  result_type rStack_40;
  result_type local_38;
  result_type rStack_30;
  
  local_38 = 0;
  rStack_30 = 0;
  local_48 = 0x8000000000000000;
  rStack_40 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_49.c = '(';
  pbVar2 = utility::operator>>(in,&local_49);
  pwVar3 = std::wistream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar3,
                               &local_4a);
  pwVar3 = std::wistream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4b.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar3,
                               &local_4b);
  pwVar3 = std::wistream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4c.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar3,
                               &local_4c);
  pwVar3 = std::wistream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_4d.c = ')';
  utility::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar3,&local_4d);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    S->r[2] = local_38;
    S->r[3] = rStack_30;
    S->r[0] = local_48;
    S->r[1] = rStack_40;
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.r[0] >> utility::delim(' ') >> S_new.r[1] >>
            utility::delim(' ') >> S_new.r[2] >> utility::delim(' ') >> S_new.r[3] >>
            utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }